

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_seckey_negate(secp256k1_context *ctx,uchar *seckey)

{
  undefined1 local_40 [4];
  int ret;
  secp256k1_scalar sec;
  uchar *seckey_local;
  secp256k1_context *ctx_local;
  
  sec.d[3] = (uint64_t)seckey;
  if (seckey == (uchar *)0x0) {
    secp256k1_callback_call(&ctx->illegal_callback,"seckey != NULL");
    ctx_local._4_4_ = 0;
  }
  else {
    ctx_local._4_4_ = secp256k1_scalar_set_b32_seckey((secp256k1_scalar *)local_40,seckey);
    secp256k1_scalar_cmov
              ((secp256k1_scalar *)local_40,&secp256k1_scalar_zero,
               (uint)((ctx_local._4_4_ != 0 ^ 0xffU) & 1));
    secp256k1_scalar_negate((secp256k1_scalar *)local_40,(secp256k1_scalar *)local_40);
    secp256k1_scalar_get_b32((uchar *)sec.d[3],(secp256k1_scalar *)local_40);
    secp256k1_scalar_clear((secp256k1_scalar *)local_40);
  }
  return ctx_local._4_4_;
}

Assistant:

int secp256k1_ec_seckey_negate(const secp256k1_context* ctx, unsigned char *seckey) {
    secp256k1_scalar sec;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_negate(&sec, &sec);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    return ret;
}